

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZEqnArray<long_double>_>::TPZVec
          (TPZVec<TPZEqnArray<long_double>_> *this,initializer_list<TPZEqnArray<long_double>_> *list
          )

{
  undefined8 *puVar1;
  TPZManVector<int,_100> *this_00;
  ulong uVar2;
  size_type sVar3;
  iterator pTVar4;
  undefined1 auVar5 [16];
  long lVar6;
  void *pvVar7;
  TPZEqnArray<long_double> *pTVar8;
  ulong uVar9;
  long lVar10;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_019b6180;
  this->fStore = (TPZEqnArray<long_double> *)0x0;
  uVar2 = list->_M_len;
  if (uVar2 != 0) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar2;
    uVar9 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x51e0),8) == 0) {
      uVar9 = SUB168(auVar5 * ZEXT816(0x51e0),0) | 0x10;
    }
    pvVar7 = operator_new__(uVar9);
    *(ulong *)((long)pvVar7 + 8) = uVar2;
    lVar10 = 0;
    pTVar8 = (TPZEqnArray<long_double> *)((long)pvVar7 + 0x10);
    do {
      TPZEqnArray<long_double>::TPZEqnArray(pTVar8);
      lVar10 = lVar10 + -0x51e0;
      pTVar8 = pTVar8 + 1;
    } while (uVar2 * -0x51e0 - lVar10 != 0);
    this->fStore = (TPZEqnArray<long_double> *)((long)pvVar7 + 0x10);
  }
  sVar3 = list->_M_len;
  if (sVar3 != 0) {
    pTVar4 = list->_M_array;
    pTVar8 = this->fStore;
    lVar10 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)(pTVar4->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar10 + -0x28);
      this_00 = (TPZManVector<int,_100> *)
                ((long)(pTVar8->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar10 + -0x20);
      *(undefined8 *)(this_00[-1].fExtAlloc + 0x62) = *puVar1;
      TPZManVector<int,_100>::operator=(this_00,(TPZManVector<int,_100> *)(puVar1 + 1));
      TPZManVector<int,_100>::operator=
                ((TPZManVector<int,_100> *)
                 ((long)(pTVar8->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar10 + -0x20)
                 ,(TPZManVector<int,_100> *)
                  ((long)(pTVar4->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar10 + -0x20
                  ));
      TPZManVector<long_double,_1000>::operator=
                ((TPZManVector<long_double,_1000> *)
                 ((long)(pTVar8->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                 lVar10 + -0x20),
                 (TPZManVector<long_double,_1000> *)
                 ((long)(pTVar4->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                 lVar10 + -0x20));
      TPZManVector<int,_1000>::operator=
                ((TPZManVector<int,_1000> *)
                 ((long)(pTVar8->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar10 + -0x20),
                 (TPZManVector<int,_1000> *)
                 ((long)(pTVar4->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar10 + -0x20));
      this_00[0x30].fExtAlloc[0x2a] = *(int *)(puVar1 + 0xa3a);
      lVar6 = lVar10 + -0x28;
      lVar10 = lVar10 + 0x51e0;
    } while ((iterator)((long)pTVar4[1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc + lVar6) !=
             pTVar4 + sVar3);
  }
  this->fNElements = uVar2;
  this->fNAlloc = uVar2;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}